

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# negative_binomial_dist.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  param_type *this;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  double r_00;
  double p_00;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  double r;
  double p;
  param_type *in_stack_ffffffffffffff88;
  param_type *in_stack_ffffffffffffffb0;
  double local_20;
  double local_18 [2];
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_8 = in_RDI;
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = (param_type *)(local_8 + *(long *)(*(long *)local_8 + -0x18));
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var2);
  utility::delim('\0');
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)this,
                               (delim_c *)in_stack_ffffffffffffff88);
  r_00 = (double)std::istream::operator>>((istream *)pbVar3,local_18);
  utility::delim('\0');
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)this,
                               (delim_c *)in_stack_ffffffffffffff88);
  p_00 = (double)std::istream::operator>>((istream *)pbVar3,&local_20);
  utility::delim('\0');
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)this,
                      (delim_c *)in_stack_ffffffffffffff88);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    negative_binomial_dist::param_type::param_type(in_stack_ffffffffffffffb0,p_00,r_00);
    negative_binomial_dist::param_type::operator=(this,in_stack_ffffffffffffff88);
    negative_binomial_dist::param_type::~param_type((param_type *)0x38c6b6);
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(std::basic_istream<char_t, traits_t> &in,
                                                   negative_binomial_dist::param_type &P) {
    double p;
    double r;
    std::ios_base::fmtflags flags(in.flags());
    in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
    in >> utility::delim('(') >> p >> utility::delim(' ') >> r >> utility::delim(')');
    if (in)
      P = negative_binomial_dist::param_type(p, r);
    in.flags(flags);
    return in;
  }